

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::anon_unknown_23::RegistryHub::registerTest
          (RegistryHub *this,unique_ptr<Catch::TestCaseInfo> *testInfo,
          unique_ptr<Catch::ITestInvoker> *invoker)

{
  unique_ptr<Catch::ITestInvoker> local_30;
  unique_ptr<Catch::TestCaseInfo> local_28;
  unique_ptr<Catch::ITestInvoker> *local_20;
  unique_ptr<Catch::ITestInvoker> *invoker_local;
  unique_ptr<Catch::TestCaseInfo> *testInfo_local;
  RegistryHub *this_local;
  
  local_20 = invoker;
  invoker_local = (unique_ptr<Catch::ITestInvoker> *)testInfo;
  testInfo_local = (unique_ptr<Catch::TestCaseInfo> *)this;
  Detail::unique_ptr<Catch::TestCaseInfo>::unique_ptr(&local_28,testInfo);
  Detail::unique_ptr<Catch::ITestInvoker>::unique_ptr(&local_30,local_20);
  TestRegistry::registerTest(&this->m_testCaseRegistry,&local_28,&local_30);
  Detail::unique_ptr<Catch::ITestInvoker>::~unique_ptr(&local_30);
  Detail::unique_ptr<Catch::TestCaseInfo>::~unique_ptr(&local_28);
  return;
}

Assistant:

void registerTest(Detail::unique_ptr<TestCaseInfo> &&testInfo, Detail::unique_ptr<ITestInvoker> &&invoker) override {
                m_testCaseRegistry.registerTest(std::move(testInfo), std::move(invoker));
            }